

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtb.cc
# Opt level: O0

void __thiscall dtc::dtb::binary_writer::write_data(binary_writer *this,uint32_t v)

{
  size_type sVar1;
  value_type_conflict1 local_15;
  uint32_t local_14;
  binary_writer *pbStack_10;
  uint32_t v_local;
  binary_writer *this_local;
  
  local_14 = v;
  pbStack_10 = this;
  while( true ) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer);
    if ((sVar1 & 3) == 0) break;
    local_15 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buffer,&local_15);
  }
  push_big_endian<unsigned_int>(&this->buffer,local_14);
  return;
}

Assistant:

void
binary_writer::write_data(uint32_t v)
{
	while (buffer.size() % 4 != 0)
	{
		buffer.push_back(0);
	}
	push_big_endian(buffer, v);
}